

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

path * __thiscall boost::filesystem::path::root_path(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  value_type *pvVar2;
  path local_70;
  path local_40;
  undefined1 local_19;
  path *local_18;
  path *this_local;
  path *temp;
  
  local_19 = 0;
  local_18 = this;
  this_local = __return_storage_ptr__;
  root_name(__return_storage_ptr__,this);
  root_directory(&local_40,this);
  bVar1 = empty(&local_40);
  ~path(&local_40);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    root_directory(&local_70,this);
    pvVar2 = c_str(&local_70);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pvVar2);
    ~path(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

path  path::root_path() const
  { 
    path temp(root_name());
    if (!root_directory().empty()) temp.m_pathname += root_directory().c_str();
    return temp;
  }